

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# doctest.h
# Opt level: O3

String * doctest::toString(String *__return_storage_ptr__,double in)

{
  _Alloc_hider __src;
  size_t sVar1;
  char *__dest;
  long lVar2;
  size_type sVar3;
  string d;
  ostringstream oss;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_1d8;
  double local_1b8;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_1b0;
  long local_190;
  undefined8 local_188 [2];
  uint auStack_178 [22];
  ios_base local_120 [264];
  
  local_1b8 = in;
  std::__cxx11::ostringstream::ostringstream((ostringstream *)&local_190);
  *(undefined8 *)((long)local_188 + *(long *)(local_190 + -0x18)) = 10;
  *(uint *)((long)auStack_178 + *(long *)(local_190 + -0x18)) =
       *(uint *)((long)auStack_178 + *(long *)(local_190 + -0x18)) & 0xfffffefb | 4;
  std::ostream::_M_insert<double>(local_1b8);
  std::__cxx11::stringbuf::str();
  if (local_1d8._M_string_length != 0) {
    lVar2 = 0;
    do {
      if (local_1d8._M_dataplus._M_p[local_1d8._M_string_length - 1] != '0') {
        if (lVar2 != 0) {
          sVar3 = local_1d8._M_string_length - 1;
          if (local_1d8._M_dataplus._M_p[local_1d8._M_string_length - 1] == '.') {
            sVar3 = local_1d8._M_string_length;
          }
          std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>::substr
                    (&local_1b0,&local_1d8,0,sVar3 + 1);
          std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>::operator=
                    (&local_1d8,&local_1b0);
          if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
               *)local_1b0._M_dataplus._M_p != &local_1b0.field_2) {
            operator_delete(local_1b0._M_dataplus._M_p,local_1b0.field_2._M_allocated_capacity + 1);
          }
        }
        break;
      }
      local_1d8._M_string_length = local_1d8._M_string_length - 1;
      lVar2 = lVar2 + 1;
    } while (local_1d8._M_string_length != 0);
  }
  __src._M_p = local_1d8._M_dataplus._M_p;
  sVar1 = strlen(local_1d8._M_dataplus._M_p);
  __dest = String::allocate(__return_storage_ptr__,(uint)sVar1);
  memcpy(__dest,__src._M_p,sVar1 & 0xffffffff);
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_1d8._M_dataplus._M_p != &local_1d8.field_2) {
    operator_delete(local_1d8._M_dataplus._M_p,local_1d8.field_2._M_allocated_capacity + 1);
  }
  std::__cxx11::ostringstream::~ostringstream((ostringstream *)&local_190);
  std::ios_base::~ios_base(local_120);
  return __return_storage_ptr__;
}

Assistant:

String toString(double in) { return fpToString(in, 10); }